

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O0

CURLcode Curl_input_ntlm(Curl_easy *data,_Bool proxy,char *header)

{
  int iVar1;
  curlntlm *local_80;
  ntlmdata *local_78;
  undefined1 local_70 [8];
  bufref hdrbuf;
  size_t hdrlen;
  uchar *hdr;
  connectdata *conn;
  curlntlm *pcStack_38;
  CURLcode result;
  curlntlm *state;
  ntlmdata *ntlm;
  char *header_local;
  Curl_easy *pCStack_18;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  hdr = (uchar *)data->conn;
  if (proxy) {
    local_78 = &((connectdata *)hdr)->proxyntlm;
  }
  else {
    local_78 = &((connectdata *)hdr)->ntlm;
  }
  state = &local_78->flags;
  if (proxy) {
    local_80 = &((connectdata *)hdr)->proxy_ntlm_state;
  }
  else {
    local_80 = &((connectdata *)hdr)->http_ntlm_state;
  }
  pcStack_38 = local_80;
  ntlm = (ntlmdata *)header;
  header_local._7_1_ = proxy;
  pCStack_18 = data;
  iVar1 = curl_strnequal(header,"NTLM",4);
  if (iVar1 != 0) {
    ntlm = (ntlmdata *)ntlm->nonce;
    Curl_str_passblanks((char **)&ntlm);
    if ((char)ntlm->flags == '\0') {
      if (*pcStack_38 == NTLMSTATE_LAST) {
        if (((pCStack_18 != (Curl_easy *)0x0) &&
            ((*(ulong *)&(pCStack_18->set).field_0x894 >> 0x1e & 1) != 0)) &&
           (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
            (0 < ((pCStack_18->state).feat)->log_level)))) {
          Curl_infof(pCStack_18,"NTLM auth restarted");
        }
        Curl_http_auth_cleanup_ntlm((connectdata *)hdr);
      }
      else {
        if (*pcStack_38 == NTLMSTATE_TYPE3) {
          if (((pCStack_18 != (Curl_easy *)0x0) &&
              ((*(ulong *)&(pCStack_18->set).field_0x894 >> 0x1e & 1) != 0)) &&
             (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
              (0 < ((pCStack_18->state).feat)->log_level)))) {
            Curl_infof(pCStack_18,"NTLM handshake rejected");
          }
          Curl_http_auth_cleanup_ntlm((connectdata *)hdr);
          *pcStack_38 = NTLMSTATE_NONE;
          return CURLE_REMOTE_ACCESS_DENIED;
        }
        if (*pcStack_38 != NTLMSTATE_NONE) {
          if (((pCStack_18 != (Curl_easy *)0x0) &&
              ((*(ulong *)&(pCStack_18->set).field_0x894 >> 0x1e & 1) != 0)) &&
             (((pCStack_18->state).feat == (curl_trc_feat *)0x0 ||
              (0 < ((pCStack_18->state).feat)->log_level)))) {
            Curl_infof(pCStack_18,"NTLM handshake failure (internal error)");
          }
          return CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      *pcStack_38 = NTLMSTATE_TYPE1;
    }
    else {
      conn._4_4_ = Curl_base64_decode((char *)ntlm,(uchar **)&hdrlen,&hdrbuf.len);
      if (conn._4_4_ == CURLE_OK) {
        Curl_bufref_init((bufref *)local_70);
        Curl_bufref_set((bufref *)local_70,(void *)hdrlen,hdrbuf.len,curl_free);
        conn._4_4_ = Curl_auth_decode_ntlm_type2_message
                               (pCStack_18,(bufref *)local_70,(ntlmdata *)state);
        Curl_bufref_free((bufref *)local_70);
      }
      if (conn._4_4_ != CURLE_OK) {
        return conn._4_4_;
      }
      *pcStack_38 = NTLMSTATE_TYPE2;
    }
  }
  return conn._4_4_;
}

Assistant:

CURLcode Curl_input_ntlm(struct Curl_easy *data,
                         bool proxy,         /* if proxy or not */
                         const char *header) /* rest of the www-authenticate:
                                                header */
{
  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  ntlm = proxy ? &conn->proxyntlm : &conn->ntlm;
  state = proxy ? &conn->proxy_ntlm_state : &conn->http_ntlm_state;

  if(checkprefix("NTLM", header)) {
    header += strlen("NTLM");

    Curl_str_passblanks(&header);
    if(*header) {
      unsigned char *hdr;
      size_t hdrlen;

      result = Curl_base64_decode(header, &hdr, &hdrlen);
      if(!result) {
        struct bufref hdrbuf;

        Curl_bufref_init(&hdrbuf);
        Curl_bufref_set(&hdrbuf, hdr, hdrlen, curl_free);
        result = Curl_auth_decode_ntlm_type2_message(data, &hdrbuf, ntlm);
        Curl_bufref_free(&hdrbuf);
      }
      if(result)
        return result;

      *state = NTLMSTATE_TYPE2; /* We got a type-2 message */
    }
    else {
      if(*state == NTLMSTATE_LAST) {
        infof(data, "NTLM auth restarted");
        Curl_http_auth_cleanup_ntlm(conn);
      }
      else if(*state == NTLMSTATE_TYPE3) {
        infof(data, "NTLM handshake rejected");
        Curl_http_auth_cleanup_ntlm(conn);
        *state = NTLMSTATE_NONE;
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      else if(*state >= NTLMSTATE_TYPE1) {
        infof(data, "NTLM handshake failure (internal error)");
        return CURLE_REMOTE_ACCESS_DENIED;
      }

      *state = NTLMSTATE_TYPE1; /* We should send away a type-1 */
    }
  }

  return result;
}